

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O0

optional<QByteArrayView> * __thiscall
QHttpHeadersPrivate::findValue(QHttpHeadersPrivate *this,HeaderName *name)

{
  bool bVar1;
  const_iterator o;
  HeaderName *in_RDI;
  long in_FS_OFFSET;
  Header *h;
  QList<Header> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  HeaderName *lhs;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (Header *)0xaaaaaaaaaaaaaaaa;
  lhs = in_RDI;
  local_10 = QList<Header>::begin((QList<Header> *)in_RDI);
  o = QList<Header>::end((QList<Header> *)lhs);
  do {
    bVar1 = QList<Header>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) {
      std::optional<QByteArrayView>::optional((optional<QByteArrayView> *)in_RDI);
LAB_001c5f29:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return (optional<QByteArrayView> *)lhs;
      }
      __stack_chk_fail();
    }
    QList<Header>::const_iterator::operator*(&local_10);
    bVar1 = ::operator==(lhs,in_RDI);
    if (bVar1) {
      std::optional<QByteArrayView>::optional<const_QByteArray_&,_true>
                ((optional<QByteArrayView> *)lhs,(QByteArray *)in_RDI);
      goto LAB_001c5f29;
    }
    QList<Header>::const_iterator::operator++(&local_10);
  } while( true );
}

Assistant:

const noexcept
{
    for (const auto &h : headers) {
        if (h.name == name)
            return h.value;
    }
    return std::nullopt;
}